

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candidate_index_impl.h
# Opt level: O3

void __thiscall
candidate_index::CandidateIndex::lookup
          (CandidateIndex *this,
          vector<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
          *sets_collection,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates,
          int number_of_labels,double distance_threshold)

{
  int iVar1;
  pointer ppVar2;
  pointer pLVar3;
  int *piVar4;
  pointer piVar5;
  pointer piVar6;
  bool bVar7;
  int iVar8;
  pointer ppVar9;
  pointer pSVar10;
  pointer ppVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  LabelSetElement *sv_r;
  CandidateIndex *this_00;
  long lVar16;
  long lVar17;
  pointer pLVar18;
  pointer pIVar19;
  long lVar20;
  int *piVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  double dVar25;
  int r_id;
  int set;
  int iStack_fc;
  vector<int,_std::allocator<int>_> M;
  vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_> set_data;
  pointer local_a0;
  vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
  r;
  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
  il_index;
  
  std::
  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
  ::vector(&il_index,(long)number_of_labels,(allocator_type *)&set_data);
  std::vector<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>::vector
            (&set_data,
             (long)(sets_collection->
                   super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(sets_collection->
                   super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&r);
  ppVar9 = (sets_collection->
           super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (ppVar9 != (sets_collection->
                super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::
      vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
      ::vector(&r,&ppVar9->second);
      ppVar2 = (sets_collection->
               super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      r_id = (int)((ulong)((long)ppVar9 - (long)ppVar2) >> 5);
      M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      iVar1 = ppVar2[r_id].first;
      dVar25 = (double)iVar1;
      if ((dVar25 <= distance_threshold) &&
         (_set = (pair<int,_int>)((ulong)_set & 0xffffffff00000000), 0 < r_id)) {
        iVar13 = 0;
        pSVar10 = set_data.
                  super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (pSVar10[iVar13].overlap == 0) {
            if (M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish ==
                M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&M,
                         (iterator)
                         M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&set);
              pSVar10 = set_data.
                        super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              *M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish = iVar13;
              M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1;
            }
          }
          pSVar10[set].overlap = pSVar10[set].overlap + 1;
          iVar13 = set + 1;
          set = iVar13;
        } while (iVar13 < r_id);
      }
      dVar25 = dVar25 - distance_threshold;
      uVar12 = 0;
      pLVar18 = r.
                super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        uVar14 = uVar12;
        if ((ulong)(((long)r.
                           super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar18 >> 3) *
                   -0x3333333333333333) <= uVar12) break;
        iVar13 = pLVar18[uVar12].id;
        uVar22 = (ulong)il_index.
                        super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar13].offset;
        ppVar11 = il_index.
                  super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar13].element_list.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar14 = (long)il_index.
                       super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar13].element_list.
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar11 >> 3;
        if (uVar22 < uVar14) {
          ppVar2 = (sets_collection->
                   super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          do {
            if (dVar25 <= (double)ppVar2[ppVar11[uVar22].first].first) break;
            uVar22 = uVar22 + 1;
            il_index.
            super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar13].offset = (int)uVar22;
          } while (uVar14 != uVar22);
          uVar22 = (ulong)(int)uVar22;
        }
        if (uVar22 < uVar14) {
          sv_r = pLVar18 + uVar12;
          local_a0 = set_data.
                     super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pIVar19 = il_index.
                    super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            iVar13 = ppVar11[uVar22].first;
            set = iVar13;
            iVar8 = pIVar19[sv_r->id].element_list.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar22].second;
            this->il_lookups_ = this->il_lookups_ + 1;
            this_00 = (CandidateIndex *)((long)iVar13 * 0x20);
            iVar8 = structural_mapping(this_00,sv_r,
                                       (LabelSetElement *)
                                       ((long)iVar8 * 0x28 +
                                       *(long *)((long)&this_00->il_lookups_ +
                                                (long)(sets_collection->
                                                                                                            
                                                  super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)),
                                       distance_threshold);
            if ((iVar8 != 0) && (local_a0[iVar13].overlap == 0)) {
              if (M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish ==
                  M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&M,
                           (iterator)
                           M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,&set);
                local_a0 = set_data.
                           super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                pLVar18 = r.
                          super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pIVar19 = il_index.
                          super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              else {
                *M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish = iVar13;
                M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish + 1;
              }
            }
            local_a0[set].overlap = local_a0[set].overlap + iVar8;
            uVar22 = uVar22 + 1;
            sv_r = pLVar18 + uVar12;
            ppVar11 = pIVar19[sv_r->id].element_list.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar22 < (ulong)((long)pIVar19[sv_r->id].element_list.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar11
                                   >> 3));
        }
        uVar14 = uVar12 + 1;
        pLVar3 = pLVar18 + uVar12;
        uVar12 = uVar14;
      } while ((double)pLVar3->weight_so_far <= distance_threshold + 1.0);
      set_data.
      super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>.
      _M_impl.super__Vector_impl_data._M_start[r_id].prefix = (int)uVar14;
      this->pre_candidates_ =
           this->pre_candidates_ +
           ((long)M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish -
            (long)M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start >> 2);
      uVar12 = (ulong)r_id;
      piVar4 = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar5 = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      pSVar10 = set_data.
                super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < set_data.
              super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar12].prefix) {
        lVar15 = 0;
        lVar20 = 0;
        lVar23 = 0;
        do {
          _set = (pair<int,_int>)((uVar12 & 0xffffffff) + lVar20);
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<std::pair<int,int>>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     &il_index.
                      super__Vector_base<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
                      ._M_impl.super__Vector_impl_data._M_start
                      [*(int *)((long)&(r.
                                        super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->id + lVar15)].
                      element_list,(pair<int,_int> *)&set);
          lVar23 = lVar23 + 1;
          uVar12 = (ulong)r_id;
          lVar20 = lVar20 + 0x100000000;
          lVar15 = lVar15 + 0x28;
          piVar4 = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          piVar5 = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
          pSVar10 = set_data.
                    super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (lVar23 < set_data.
                          super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar12].prefix);
      }
      for (; piVar6 = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,
          piVar4 != M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish; piVar4 = piVar4 + 1) {
        lVar24 = (long)*piVar4;
        set = *piVar4;
        ppVar2 = (sets_collection->
                 super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar20 = (long)pSVar10[r_id].prefix;
        lVar23 = (long)pSVar10[lVar24].prefix;
        lVar15 = *(long *)&ppVar2[lVar24].second.
                           super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                           ._M_impl;
        iVar13 = pSVar10[lVar24].overlap;
        if (*(int *)(lVar15 + -0x28 + lVar23 * 0x28) <
            r.
            super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar20 + -1].id) {
          lVar20 = 1;
          if ((r.
               super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
               ._M_impl.super__Vector_impl_data._M_start)->weight_so_far < iVar13) {
            lVar17 = ((long)r.
                            super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)r.
                            super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
            lVar16 = 0;
            piVar21 = &r.
                       super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].weight_so_far;
            do {
              lVar20 = lVar17;
              if (lVar17 - lVar16 == 0) break;
              lVar20 = lVar16 + 1;
              iVar8 = *piVar21;
              lVar16 = lVar20;
              piVar21 = piVar21 + 10;
            } while (iVar8 < iVar13);
            lVar20 = lVar20 + 1;
          }
        }
        else {
          lVar23 = 1;
          if (*(int *)(lVar15 + 8) < iVar13) {
            lVar17 = ((long)*(pointer *)
                             ((long)&ppVar2[lVar24].second.
                                     super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                     ._M_impl + 8) - lVar15 >> 3) * -0x3333333333333333;
            lVar16 = 0;
            piVar21 = (int *)(lVar15 + 0x30);
            do {
              lVar23 = lVar17;
              if (lVar17 - lVar16 == 0) break;
              lVar23 = lVar16 + 1;
              iVar8 = *piVar21;
              lVar16 = lVar23;
              piVar21 = piVar21 + 10;
            } while (iVar8 < iVar13);
            lVar23 = lVar23 + 1;
          }
        }
        M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             piVar5;
        bVar7 = structural_filter((CandidateIndex *)(lVar23 * 5),&r,&ppVar2[lVar24].second,dVar25,
                                  iVar13,(int)lVar20,(int)lVar23,(int)distance_threshold,
                                  (iVar1 - r.
                                           super__Vector_base<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar20 + -1].
                                           weight_so_far) + iVar13,
                                  (ppVar2[lVar24].first + iVar13) -
                                  *(int *)(lVar15 + -0x20 + lVar23 * 0x28));
        if (bVar7) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int&,int&>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     join_candidates,&r_id,&set);
          lVar24 = (long)set;
          pSVar10 = set_data.
                    super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        pSVar10[lVar24].overlap = 0;
        piVar5 = M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             piVar6;
      }
      M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           piVar5;
      if (M.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          != (pointer)0x0) {
        operator_delete(M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)M.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
      ::~vector(&r);
      ppVar9 = ppVar9 + 1;
    } while (ppVar9 != (sets_collection->
                       super__Vector_base<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>,_std::allocator<std::pair<int,_std::vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  if (set_data.
      super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(set_data.
                    super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)set_data.
                          super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)set_data.
                          super__Vector_base<candidate_index::SetData,_std::allocator<candidate_index::SetData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<candidate_index::InvertedListElement,_std::allocator<candidate_index::InvertedListElement>_>
  ::~vector(&il_index);
  return;
}

Assistant:

void CandidateIndex::lookup(
    std::vector<std::pair<int, std::vector<label_set_converter::LabelSetElement>>>& sets_collection,
    std::vector<std::pair<int, int>>& join_candidates,
    const int number_of_labels, 
    const double distance_threshold) {
  // inverted list index.
  std::vector<candidate_index::InvertedListElement> il_index(number_of_labels);
  // containing specific data of a set. (e.g. actual overlap, index prefix)
  std::vector<candidate_index::SetData> set_data(sets_collection.size());
  // position in label set while processing r
  std::size_t p = 0;

  // iterate through all sets in the given collection
  std::vector<std::pair<int, std::vector<label_set_converter::LabelSetElement>>>::iterator r_it = sets_collection.begin();
  for (; r_it != sets_collection.end(); ++r_it) {
    std::pair<int, std::vector<label_set_converter::LabelSetElement>>& r_pair = *r_it; // dereference iterator to current set once
    std::vector<label_set_converter::LabelSetElement> r = r_pair.second; // dereference iterator to current set once
    int r_id = r_it - sets_collection.begin(); // identifier for r (line number)
    std::vector<int> M; // holds the set identifiers of the candidate pairs, 
                                 // the overlap is stored in the set_data
    int r_size = sets_collection[r_id].first; // number of elements in r

    // *****************************
    // ** Generate pre candidates **
    // *****************************
    // add all small trees that does not have to share a common label in the prefix
    if(r_size <= distance_threshold) 
      for(int i = 0; i < r_id; ++i) {
        if(set_data[i].overlap == 0) 
          M.push_back(i); // if not, add it to the candidate set M
        ++set_data[i].overlap; // increase overlap for set i
      }

    // iterate through probing prefix elements and extend the candidate set
    p = 0;
    // until tau + 1 nodes of the probing set are processed
    while(p < r.size()) {
      // remove all entries in the inverted list index up to the position where 
      // the size is greater than the lower bound
      for(std::size_t s = il_index[r[p].id].offset; s < il_index[r[p].id].element_list.size() &&
          sets_collection[il_index[r[p].id].element_list[s].first].first < r_size - distance_threshold; s++)
        ++il_index[r[p].id].offset;

      // iterate through all remaining sets for the current token r[p] in the 
      // inverted list index and add them to the candidates
      for(std::size_t s = il_index[r[p].id].offset; s < il_index[r[p].id].element_list.size(); s++) {
        int set = il_index[r[p].id].element_list[s].first;
        int pos = il_index[r[p].id].element_list[s].second;
        // increase the number of lookups in the inverted list
        ++il_lookups_;

        int tau_valid = structural_mapping(r[p], sets_collection[set].second[pos], distance_threshold);
        if(tau_valid != 0 && set_data[set].overlap == 0) 
          M.push_back(set); // if not, add it to the candidate set M
        set_data[set].overlap += tau_valid;
        
      }
      // stop as soon as tau + 1 elements have been discovered
      p++;
      if(r[p-1].weight_so_far > distance_threshold + 1)
        break;
    }

    // store last postition of the index of the label set
    set_data[r_id].prefix = p;
    // count number of precandidates
    pre_candidates_ += M.size();
    
    // add all elements in the prefix of r in the inverted list
    for(int p = 0; p < set_data[r_id].prefix; p++)
      il_index[r[p].id].element_list.push_back(std::make_pair(r_id, p));

    // *****************************
    // *** Verify pre candidates ***
    // *****************************
    // compute structural filter for each candidate (r, s) in M
    for (int m: M) {
      std::vector<label_set_converter::LabelSetElement>& s = sets_collection[m].second;
      // prefix positions for sets r and s in the candidate pair
      std::size_t pr = 0, ps = 0;

      // check last prefix position; the smaller one starts at prefix position, 
      // the greater one starts at the overlap
      if (r[set_data[r_id].prefix-1].id > s[set_data[m].prefix-1].id) {
        for(; r[pr].weight_so_far < set_data[m].overlap && pr < r.size(); ++pr) {}
        ++pr;
        ps = set_data[m].prefix;
      } else {
        pr = set_data[r_id].prefix;
        for(; s[ps].weight_so_far < set_data[m].overlap && ps < s.size(); ++ps) {}
        ++ps;
      }

      int maxr = r_size - r[pr-1].weight_so_far + set_data[m].overlap;
      int maxs = sets_collection[m].first - s[ps-1].weight_so_far + set_data[m].overlap;

      // overlap needed for threshold tau between r and s
      const double eqoverlap = r_size - distance_threshold;

      // verify if r and s belong to the resultset, computed the structural filter
      if (structural_filter(r, s, eqoverlap, set_data[m].overlap, pr, ps, distance_threshold, maxr, maxs))
        join_candidates.emplace_back(r_id, m);

      // reset overlap in set_data
      set_data[m].overlap = 0;
    }
  }
}